

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

Transform * __thiscall
iDynTree::KinDynComputations::getWorldTransform(KinDynComputations *this,FrameIndex frameIndex)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  Transform *pTVar4;
  LinkPositions *this_00;
  long in_RDX;
  long in_RSI;
  Transform *in_RDI;
  Transform link_H_frame;
  Transform world_H_link;
  Transform *world_H_frame;
  KinDynComputations *in_stack_fffffffffffffea0;
  Transform local_138 [96];
  undefined1 local_d8 [96];
  Transform local_78 [96];
  long local_18;
  
  local_18 = in_RDX;
  uVar1 = getNrOfFrames((KinDynComputations *)0x1ca8fb);
  if (in_RDX < (long)(ulong)uVar1) {
    computeFwdKinematics(in_stack_fffffffffffffea0);
    if ((*(byte *)(*(long *)(in_RSI + 8) + 0x2f0) & 1) == 0) {
      iDynTree::reportError
                ("KinDynComputations","getWorldTransform","error in computing fwd kinematics");
      iDynTree::Transform::Identity();
    }
    else {
      iDynTree::Transform::Transform(in_RDI);
      uVar2 = iDynTree::Model::isValidLinkIndex(*(long *)(in_RSI + 8) + 8);
      if ((uVar2 & 1) == 0) {
        this_00 = (LinkPositions *)(*(long *)(in_RSI + 8) + 0x2f8);
        lVar3 = iDynTree::Model::getFrameLink(*(long *)(in_RSI + 8) + 8);
        pTVar4 = (Transform *)iDynTree::LinkPositions::operator()(this_00,lVar3);
        iDynTree::Transform::Transform(local_78,pTVar4);
        iDynTree::Model::getFrameTransform((long)local_d8);
        iDynTree::Transform::operator*(local_138,local_78);
        iDynTree::Transform::operator=(in_RDI,local_138);
      }
      else {
        pTVar4 = (Transform *)
                 iDynTree::LinkPositions::operator()
                           ((LinkPositions *)(*(long *)(in_RSI + 8) + 0x2f8),local_18);
        iDynTree::Transform::operator=(in_RDI,pTVar4);
      }
    }
  }
  else {
    iDynTree::reportError("KinDynComputations","getWorldTransform","frameIndex out of bound");
    iDynTree::Transform::Identity();
  }
  return in_RDI;
}

Assistant:

Transform KinDynComputations::getWorldTransform(const FrameIndex frameIndex)
{
    if( frameIndex >= this->getNrOfFrames() )
    {
        reportError("KinDynComputations","getWorldTransform","frameIndex out of bound");
        return iDynTree::Transform::Identity();
    }

    // compute fwd kinematics (if necessary)
    this->computeFwdKinematics();

    if( !this->pimpl->m_isFwdKinematicsUpdated )
    {
        reportError("KinDynComputations","getWorldTransform","error in computing fwd kinematics");
        return iDynTree::Transform::Identity();
    }


    iDynTree::Transform world_H_frame;

    // If the frame is associated to a link,
    // then return directly the content in linkPos
    if( this->pimpl->m_robot_model.isValidLinkIndex(frameIndex) )
    {
        world_H_frame = this->pimpl->m_linkPos(frameIndex);
    }
    else
    {
        // otherwise we extract from the result of position kinematics
        // the transform between the world and the link at which the
        // frame is attached
        iDynTree::Transform world_H_link =
            this->pimpl->m_linkPos(this->pimpl->m_robot_model.getFrameLink(frameIndex));
        iDynTree::Transform link_H_frame =
            this->pimpl->m_robot_model.getFrameTransform(frameIndex);

        world_H_frame = world_H_link*link_H_frame;
    }

    return world_H_frame;
}